

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_posix_convert.cpp
# Opt level: O0

void test_char<wchar_t>(void)

{
  bool bVar1;
  wint_t wVar2;
  ostream *poVar3;
  char *__locale;
  undefined8 uVar4;
  int iVar5;
  locale_t cl;
  locale l_2;
  locale l_1;
  string name;
  locale l;
  generator gen;
  string *in_stack_fffffffffffffbe8;
  string *in_stack_fffffffffffffbf0;
  generator *in_stack_fffffffffffffbf8;
  allocator *paVar6;
  runtime_error *in_stack_fffffffffffffc00;
  allocator local_309;
  string local_308 [39];
  allocator local_2e1;
  string local_2e0 [39];
  allocator local_2b9;
  string local_2b8 [32];
  locale local_298 [14];
  undefined1 local_28a;
  allocator local_289;
  string local_288 [32];
  __locale_t local_268;
  allocator local_259;
  string local_258 [39];
  allocator local_231;
  string local_230 [39];
  allocator local_209;
  string local_208 [39];
  allocator local_1e1;
  string local_1e0 [39];
  allocator local_1b9;
  string *in_stack_fffffffffffffe48;
  string *in_stack_fffffffffffffe50;
  string *in_stack_fffffffffffffe58;
  locale *in_stack_fffffffffffffe60;
  allocator local_191;
  string local_190 [32];
  locale local_170 [15];
  allocator local_161;
  string local_160 [39];
  allocator local_139;
  string local_138 [39];
  allocator local_111;
  string local_110 [32];
  locale local_f0 [15];
  allocator local_e1;
  string local_e0 [39];
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [39];
  allocator local_69;
  string local_68 [39];
  allocator local_41;
  string local_40 [32];
  locale local_20 [24];
  generator local_8 [8];
  
  booster::locale::generator::generator(local_8);
  poVar3 = std::operator<<((ostream *)&std::cout,"- Testing at least C");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"en_US.UTF-8",&local_41);
  booster::locale::generator::operator()(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"Hello World i",&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"hello world i",&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"HELLO WORLD I",&local_b9);
  test_one<wchar_t>(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                    in_stack_fffffffffffffe48);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"en_US.UTF-8",&local_e1);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  bVar1 = have_locale(in_stack_fffffffffffffbe8);
  if (bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cout,"- Testing ");
    poVar3 = std::operator<<(poVar3,local_e0);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    booster::locale::generator::operator()(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_110,anon_var_dwarf_2740,&local_111);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_138,anon_var_dwarf_274a,&local_139);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_160,anon_var_dwarf_2754,&local_161);
    test_one<wchar_t>(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                      in_stack_fffffffffffffe48);
    std::__cxx11::string::~string(local_160);
    std::allocator<char>::~allocator((allocator<char> *)&local_161);
    std::__cxx11::string::~string(local_138);
    std::allocator<char>::~allocator((allocator<char> *)&local_139);
    std::__cxx11::string::~string(local_110);
    std::allocator<char>::~allocator((allocator<char> *)&local_111);
    std::locale::~locale(local_f0);
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"- en_US.UTF-8 is not supported, skipping");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::string::operator=(local_e0,"en_US.ISO8859-1");
  bVar1 = have_locale(in_stack_fffffffffffffbe8);
  if (bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Testing ");
    poVar3 = std::operator<<(poVar3,local_e0);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    booster::locale::generator::operator()(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_190,"Hello World",&local_191);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&stack0xfffffffffffffe48,"hello world",&local_1b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1e0,"HELLO WORLD",&local_1e1);
    test_one<wchar_t>(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                      in_stack_fffffffffffffe48);
    std::__cxx11::string::~string(local_1e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe48);
    std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
    std::__cxx11::string::~string(local_190);
    std::allocator<char>::~allocator((allocator<char> *)&local_191);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_208,anon_var_dwarf_2740,&local_209);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_230,anon_var_dwarf_274a,&local_231);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_258,anon_var_dwarf_2754,&local_259);
    test_one<wchar_t>(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                      in_stack_fffffffffffffe48);
    std::__cxx11::string::~string(local_258);
    std::allocator<char>::~allocator((allocator<char> *)&local_259);
    std::__cxx11::string::~string(local_230);
    std::allocator<char>::~allocator((allocator<char> *)&local_231);
    std::__cxx11::string::~string(local_208);
    std::allocator<char>::~allocator((allocator<char> *)&local_209);
    std::locale::~locale(local_170);
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"- en_US.ISO8859-1 is not supported, skipping");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::string::operator=(local_e0,"tr_TR.UTF-8");
  bVar1 = have_locale(in_stack_fffffffffffffbe8);
  if (bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Testing ");
    poVar3 = std::operator<<(poVar3,local_e0);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    __locale = (char *)std::__cxx11::string::c_str();
    local_268 = newlocale(0x1fbf,__locale,(__locale_t)0x0);
    test_counter = test_counter + 1;
    if (local_268 == (__locale_t)0x0) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x4c);
      poVar3 = std::operator<<(poVar3," cl");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      iVar5 = error_counter + 1;
      bVar1 = 0x14 < error_counter;
      error_counter = iVar5;
      if (bVar1) {
        local_28a = 1;
        uVar4 = __cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_288,"Error limits reached, stopping unit test",&local_289);
        booster::runtime_error::runtime_error
                  (in_stack_fffffffffffffc00,(string *)in_stack_fffffffffffffbf8);
        local_28a = 0;
        __cxa_throw(uVar4,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
      }
    }
    wVar2 = towupper_l(0x69,local_268);
    if (wVar2 == 0x130) {
      booster::locale::generator::operator()(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2b8,"i",&local_2b9);
      paVar6 = &local_2e1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2e0,"i",paVar6);
      paVar6 = &local_309;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_308,anon_var_dwarf_2812,paVar6);
      test_one<wchar_t>(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                        in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
      std::__cxx11::string::~string(local_308);
      std::allocator<char>::~allocator((allocator<char> *)&local_309);
      std::__cxx11::string::~string(local_2e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
      std::__cxx11::string::~string(local_2b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
      std::locale::~locale(local_298);
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cout,"  Turkish locale is not supported well");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    if (local_268 != (__locale_t)0x0) {
      freelocale(local_268);
    }
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"- tr_TR.UTF-8 is not supported, skipping");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::string::~string(local_e0);
  std::locale::~locale(local_20);
  booster::locale::generator::~generator(local_8);
  return;
}

Assistant:

void test_char()
{
    booster::locale::generator gen;

    std::cout << "- Testing at least C" << std::endl;

    std::locale l = gen("en_US.UTF-8");

    test_one<CharType>(l,"Hello World i","hello world i","HELLO WORLD I");

    std::string name = "en_US.UTF-8";
    if(have_locale(name)) {
        std::cout << "- Testing " << name << std::endl;
        std::locale l=gen(name);
        test_one<CharType>(l,"Façade","façade","FAÇADE");
    }
    else {
        std::cout << "- en_US.UTF-8 is not supported, skipping" << std::endl;
    }

    name = "en_US.ISO8859-1";
    if(have_locale(name)) {
        std::cout << "Testing " << name << std::endl;
        std::locale l=gen(name);
        test_one<CharType>(l,"Hello World","hello world","HELLO WORLD");
        #if defined(__APPLE__) || defined(__FreeBSD__)
        if(sizeof(CharType)!=1)
        #endif
            test_one<CharType>(l,"Façade","façade","FAÇADE");
    }
    else {
        std::cout << "- en_US.ISO8859-1 is not supported, skipping" << std::endl;
    }
    
    name = "tr_TR.UTF-8";
    if(have_locale(name)) {
        std::cout << "Testing " << name << std::endl;
        locale_t cl = newlocale(LC_ALL_MASK,name.c_str(),0);
        try { 
            TEST(cl);
            if(towupper_l(L'i',cl) == 0x130) {
                test_one<CharType>(gen(name),"i","i","İ");
            }
            else {
                std::cout <<"  Turkish locale is not supported well" << std::endl;
            }
        }
        catch(...) {
            if(cl) freelocale(cl);
            throw;
        }
        if(cl) freelocale(cl);
        
    }
    else 
    {
        std::cout << "- tr_TR.UTF-8 is not supported, skipping" << std::endl;
    }
}